

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

int google::protobuf::compiler::csharp::GetFixedSize(Type type)

{
  LogMessage LStack_18;
  
  if (type - TYPE_DOUBLE < 0x12) {
    return *(int *)(&DAT_01337bec + (ulong)(type - TYPE_DOUBLE) * 4);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_helpers.cc"
             ,300);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_18,(char (*) [16])"Can\'t get here.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

int GetFixedSize(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      return -1;
    case FieldDescriptor::TYPE_INT64:
      return -1;
    case FieldDescriptor::TYPE_UINT32:
      return -1;
    case FieldDescriptor::TYPE_UINT64:
      return -1;
    case FieldDescriptor::TYPE_SINT32:
      return -1;
    case FieldDescriptor::TYPE_SINT64:
      return -1;
    case FieldDescriptor::TYPE_FIXED32:
      return internal::WireFormatLite::kFixed32Size;
    case FieldDescriptor::TYPE_FIXED64:
      return internal::WireFormatLite::kFixed64Size;
    case FieldDescriptor::TYPE_SFIXED32:
      return internal::WireFormatLite::kSFixed32Size;
    case FieldDescriptor::TYPE_SFIXED64:
      return internal::WireFormatLite::kSFixed64Size;
    case FieldDescriptor::TYPE_FLOAT:
      return internal::WireFormatLite::kFloatSize;
    case FieldDescriptor::TYPE_DOUBLE:
      return internal::WireFormatLite::kDoubleSize;

    case FieldDescriptor::TYPE_BOOL:
      return internal::WireFormatLite::kBoolSize;
    case FieldDescriptor::TYPE_ENUM:
      return -1;

    case FieldDescriptor::TYPE_STRING:
      return -1;
    case FieldDescriptor::TYPE_BYTES:
      return -1;
    case FieldDescriptor::TYPE_GROUP:
      return -1;
    case FieldDescriptor::TYPE_MESSAGE:
      return -1;

      // No default because we want the compiler to complain if any new
      // types are added.
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return -1;
}